

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::EventControl::EventControl(EventControl *this,EventEdgeType edge,Var *var)

{
  int iVar1;
  UserException *this_00;
  string local_40;
  allocator<char> local_19;
  
  this->delay = 0;
  this->var = var;
  this->type = Edge;
  this->edge = edge;
  this->delay_side = left;
  iVar1 = (*(var->super_IRNode)._vptr_IRNode[7])(var);
  if (iVar1 == 1) {
    return;
  }
  this_00 = (UserException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Event control variable cannot be a scalar",&local_19);
  UserException::UserException(this_00,&local_40);
  __cxa_throw(this_00,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

EventControl::EventControl(kratos::EventEdgeType edge, kratos::Var &var)
    : var(&var), type(EventControlType::Edge), edge(edge) {
    if (var.width() != 1) {
        throw UserException("Event control variable cannot be a scalar");
    }
}